

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigopcount_tests.cpp
# Opt level: O0

void __thiscall sigopcount_tests::GetSigOpCount::test_method(GetSigOpCount *this)

{
  span<const_unsigned_char,_18446744073709551615UL> b;
  span<const_unsigned_char,_18446744073709551615UL> b_00;
  span<const_unsigned_char,_18446744073709551615UL> b_01;
  span<const_unsigned_char,_18446744073709551615UL> b_02;
  span<const_unsigned_char,_18446744073709551615UL> b_03;
  span<const_unsigned_char,_18446744073709551615UL> b_04;
  bool bVar1;
  CScript *this_00;
  __extent_storage<18446744073709551615UL> s;
  long in_FS_OFFSET;
  int i;
  CKey k;
  vector<CPubKey,_std::allocator<CPubKey>_> keys;
  CScript scriptSig2;
  CScript s2;
  CScript scriptSig;
  CScript p2sh;
  uint160 dummy;
  CScript s1;
  char *in_stack_fffffffffffff758;
  lazy_ostream *in_stack_fffffffffffff760;
  char *in_stack_fffffffffffff768;
  undefined7 in_stack_fffffffffffff770;
  undefined1 in_stack_fffffffffffff777;
  CScript *in_stack_fffffffffffff778;
  undefined4 in_stack_fffffffffffff780;
  uint in_stack_fffffffffffff784;
  lazy_ostream *in_stack_fffffffffffff788;
  const_string *in_stack_fffffffffffff790;
  const_string *file;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffff798;
  vector<CPubKey,_std::allocator<CPubKey>_> *in_stack_fffffffffffff7a0;
  CScript *in_stack_fffffffffffff7a8;
  CScript *scriptSig_00;
  CScript *in_stack_fffffffffffff7b0;
  int local_6f8;
  lazy_ostream local_6d8;
  undefined1 local_6c0 [184];
  lazy_ostream local_608;
  undefined1 local_5f0 [64];
  lazy_ostream local_5b0;
  undefined1 local_598 [64];
  lazy_ostream local_558;
  undefined1 local_540 [64];
  lazy_ostream local_500;
  undefined1 local_4e8 [104];
  lazy_ostream local_480;
  undefined1 local_468 [104];
  lazy_ostream local_400;
  undefined1 local_3e8 [64];
  lazy_ostream local_3a8;
  undefined1 local_390 [64];
  lazy_ostream local_350;
  undefined1 local_338 [144];
  lazy_ostream local_2a8;
  undefined1 local_290 [64];
  lazy_ostream local_250;
  undefined1 local_238 [64];
  CScript local_1f8 [15];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  CScript::CScript((CScript *)in_stack_fffffffffffff758);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff768,
               (pointer)in_stack_fffffffffffff760,(unsigned_long)in_stack_fffffffffffff758);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff758);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff798._M_extent_value,
               in_stack_fffffffffffff790,(size_t)in_stack_fffffffffffff788,
               (const_string *)CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff760,(char (*) [1])in_stack_fffffffffffff758);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff768,
               (pointer)in_stack_fffffffffffff760,(unsigned_long)in_stack_fffffffffffff758);
    local_250._vptr_lazy_ostream._4_4_ =
         CScript::GetSigOpCount(in_stack_fffffffffffff778,(bool)in_stack_fffffffffffff777);
    local_250._vptr_lazy_ostream._0_4_ = 0;
    in_stack_fffffffffffff768 = "0U";
    in_stack_fffffffffffff760 = &local_250;
    in_stack_fffffffffffff758 = "s1.GetSigOpCount(false)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (local_238,&local_250.m_empty,0x23,1,2,
               (undefined1 *)((long)&local_250._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff758);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff768,
               (pointer)in_stack_fffffffffffff760,(unsigned_long)in_stack_fffffffffffff758);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff758);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff798._M_extent_value,
               in_stack_fffffffffffff790,(size_t)in_stack_fffffffffffff788,
               (const_string *)CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff760,(char (*) [1])in_stack_fffffffffffff758);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff768,
               (pointer)in_stack_fffffffffffff760,(unsigned_long)in_stack_fffffffffffff758);
    local_2a8._vptr_lazy_ostream._4_4_ =
         CScript::GetSigOpCount(in_stack_fffffffffffff778,(bool)in_stack_fffffffffffff777);
    local_2a8._vptr_lazy_ostream._0_4_ = 0;
    in_stack_fffffffffffff768 = "0U";
    in_stack_fffffffffffff760 = &local_2a8;
    in_stack_fffffffffffff758 = "s1.GetSigOpCount(true)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (local_290,&local_2a8.m_empty,0x24,1,2,
               (undefined1 *)((long)&local_2a8._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff758);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  uint160::uint160((uint160 *)in_stack_fffffffffffff758);
  CScript::operator<<((CScript *)in_stack_fffffffffffff790,
                      (opcodetype)((ulong)in_stack_fffffffffffff788 >> 0x20));
  ToByteVector<uint160>((uint160 *)in_stack_fffffffffffff798._M_extent_value);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_fffffffffffff768,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff760);
  b._M_extent._M_extent_value = in_stack_fffffffffffff798._M_extent_value;
  b._M_ptr = (pointer)in_stack_fffffffffffff790;
  CScript::operator<<(in_stack_fffffffffffff778,b);
  ToByteVector<uint160>((uint160 *)in_stack_fffffffffffff798._M_extent_value);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_fffffffffffff768,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff760);
  b_00._M_extent._M_extent_value = in_stack_fffffffffffff798._M_extent_value;
  b_00._M_ptr = (pointer)in_stack_fffffffffffff790;
  CScript::operator<<(in_stack_fffffffffffff778,b_00);
  CScript::operator<<((CScript *)in_stack_fffffffffffff790,
                      (opcodetype)((ulong)in_stack_fffffffffffff788 >> 0x20));
  CScript::operator<<((CScript *)in_stack_fffffffffffff790,
                      (opcodetype)((ulong)in_stack_fffffffffffff788 >> 0x20));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff768);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff768);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff768,
               (pointer)in_stack_fffffffffffff760,(unsigned_long)in_stack_fffffffffffff758);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff758);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff798._M_extent_value,
               in_stack_fffffffffffff790,(size_t)in_stack_fffffffffffff788,
               (const_string *)CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff760,(char (*) [1])in_stack_fffffffffffff758);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff768,
               (pointer)in_stack_fffffffffffff760,(unsigned_long)in_stack_fffffffffffff758);
    local_350._vptr_lazy_ostream._4_4_ =
         CScript::GetSigOpCount(in_stack_fffffffffffff778,(bool)in_stack_fffffffffffff777);
    local_350._vptr_lazy_ostream._0_4_ = 2;
    in_stack_fffffffffffff768 = "2U";
    in_stack_fffffffffffff760 = &local_350;
    in_stack_fffffffffffff758 = "s1.GetSigOpCount(true)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (local_338,&local_350.m_empty,0x28,1,2,
               (undefined1 *)((long)&local_350._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff758);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  CScript::operator<<((CScript *)in_stack_fffffffffffff790,
                      (opcodetype)((ulong)in_stack_fffffffffffff788 >> 0x20));
  CScript::operator<<((CScript *)in_stack_fffffffffffff790,
                      (opcodetype)((ulong)in_stack_fffffffffffff788 >> 0x20));
  CScript::operator<<((CScript *)in_stack_fffffffffffff790,
                      (opcodetype)((ulong)in_stack_fffffffffffff788 >> 0x20));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff768,
               (pointer)in_stack_fffffffffffff760,(unsigned_long)in_stack_fffffffffffff758);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff758);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff798._M_extent_value,
               in_stack_fffffffffffff790,(size_t)in_stack_fffffffffffff788,
               (const_string *)CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff760,(char (*) [1])in_stack_fffffffffffff758);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff768,
               (pointer)in_stack_fffffffffffff760,(unsigned_long)in_stack_fffffffffffff758);
    local_3a8._vptr_lazy_ostream._4_4_ =
         CScript::GetSigOpCount(in_stack_fffffffffffff778,(bool)in_stack_fffffffffffff777);
    local_3a8._vptr_lazy_ostream._0_4_ = 3;
    in_stack_fffffffffffff768 = "3U";
    in_stack_fffffffffffff760 = &local_3a8;
    in_stack_fffffffffffff758 = "s1.GetSigOpCount(true)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (local_390,&local_3a8.m_empty,0x2a,1,2,
               (undefined1 *)((long)&local_3a8._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff758);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff768,
               (pointer)in_stack_fffffffffffff760,(unsigned_long)in_stack_fffffffffffff758);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff758);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff798._M_extent_value,
               in_stack_fffffffffffff790,(size_t)in_stack_fffffffffffff788,
               (const_string *)CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff760,(char (*) [1])in_stack_fffffffffffff758);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff768,
               (pointer)in_stack_fffffffffffff760,(unsigned_long)in_stack_fffffffffffff758);
    local_400._vptr_lazy_ostream._4_4_ =
         CScript::GetSigOpCount(in_stack_fffffffffffff778,(bool)in_stack_fffffffffffff777);
    local_400._vptr_lazy_ostream._0_4_ = 0x15;
    in_stack_fffffffffffff768 = "21U";
    in_stack_fffffffffffff760 = &local_400;
    in_stack_fffffffffffff758 = "s1.GetSigOpCount(false)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (local_3e8,&local_400.m_empty,0x2b,1,2,
               (undefined1 *)((long)&local_400._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff758);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  ScriptHash::ScriptHash
            ((ScriptHash *)CONCAT17(in_stack_fffffffffffff777,in_stack_fffffffffffff770),
             (CScript *)in_stack_fffffffffffff768);
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<ScriptHash,void,void,ScriptHash,void>
            ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_fffffffffffff768,(ScriptHash *)in_stack_fffffffffffff760);
  GetScriptForDestination((CTxDestination *)in_stack_fffffffffffff758);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_fffffffffffff758);
  CScript::CScript((CScript *)in_stack_fffffffffffff758);
  CScript::operator<<((CScript *)in_stack_fffffffffffff790,
                      (opcodetype)((ulong)in_stack_fffffffffffff788 >> 0x20));
  Serialize((CScript *)in_stack_fffffffffffff798._M_extent_value);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_fffffffffffff768,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff760);
  b_01._M_extent._M_extent_value = in_stack_fffffffffffff798._M_extent_value;
  b_01._M_ptr = (pointer)in_stack_fffffffffffff790;
  CScript::operator<<(in_stack_fffffffffffff778,b_01);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff768);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff768,
               (pointer)in_stack_fffffffffffff760,(unsigned_long)in_stack_fffffffffffff758);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff758);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff798._M_extent_value,
               in_stack_fffffffffffff790,(size_t)in_stack_fffffffffffff788,
               (const_string *)CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff760,(char (*) [1])in_stack_fffffffffffff758);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff768,
               (pointer)in_stack_fffffffffffff760,(unsigned_long)in_stack_fffffffffffff758);
    local_480._vptr_lazy_ostream._4_4_ =
         CScript::GetSigOpCount(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8);
    local_480._vptr_lazy_ostream._0_4_ = 3;
    in_stack_fffffffffffff768 = "3U";
    in_stack_fffffffffffff760 = &local_480;
    in_stack_fffffffffffff758 = "p2sh.GetSigOpCount(scriptSig)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (local_468,&local_480.m_empty,0x30,1,2,
               (undefined1 *)((long)&local_480._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff758);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  std::vector<CPubKey,_std::allocator<CPubKey>_>::vector
            ((vector<CPubKey,_std::allocator<CPubKey>_> *)in_stack_fffffffffffff758);
  for (local_6f8 = 0; local_6f8 < 3; local_6f8 = local_6f8 + 1) {
    GenerateRandomKey(SUB81((ulong)in_stack_fffffffffffff760 >> 0x38,0));
    CKey::GetPubKey((CKey *)CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780));
    std::vector<CPubKey,_std::allocator<CPubKey>_>::push_back
              ((vector<CPubKey,_std::allocator<CPubKey>_> *)in_stack_fffffffffffff758,
               (value_type *)0xadffc5);
    CKey::~CKey((CKey *)in_stack_fffffffffffff758);
  }
  GetScriptForMultisig((int)((ulong)in_stack_fffffffffffff7a8 >> 0x20),in_stack_fffffffffffff7a0);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff768,
               (pointer)in_stack_fffffffffffff760,(unsigned_long)in_stack_fffffffffffff758);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff758);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff798._M_extent_value,
               in_stack_fffffffffffff790,(size_t)in_stack_fffffffffffff788,
               (const_string *)CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff760,(char (*) [1])in_stack_fffffffffffff758);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff768,
               (pointer)in_stack_fffffffffffff760,(unsigned_long)in_stack_fffffffffffff758);
    local_500._vptr_lazy_ostream._4_4_ =
         CScript::GetSigOpCount(in_stack_fffffffffffff778,(bool)in_stack_fffffffffffff777);
    local_500._vptr_lazy_ostream._0_4_ = 3;
    in_stack_fffffffffffff768 = "3U";
    in_stack_fffffffffffff760 = &local_500;
    in_stack_fffffffffffff758 = "s2.GetSigOpCount(true)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (local_4e8,&local_500.m_empty,0x39,1,2,
               (undefined1 *)((long)&local_500._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff758);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff768,
               (pointer)in_stack_fffffffffffff760,(unsigned_long)in_stack_fffffffffffff758);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff758);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff798._M_extent_value,
               in_stack_fffffffffffff790,(size_t)in_stack_fffffffffffff788,
               (const_string *)CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff760,(char (*) [1])in_stack_fffffffffffff758);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff768,
               (pointer)in_stack_fffffffffffff760,(unsigned_long)in_stack_fffffffffffff758);
    local_558._vptr_lazy_ostream._4_4_ =
         CScript::GetSigOpCount(in_stack_fffffffffffff778,(bool)in_stack_fffffffffffff777);
    local_558._vptr_lazy_ostream._0_4_ = 0x14;
    in_stack_fffffffffffff768 = "20U";
    in_stack_fffffffffffff760 = &local_558;
    in_stack_fffffffffffff758 = "s2.GetSigOpCount(false)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (local_540,&local_558.m_empty,0x3a,1,2,
               (undefined1 *)((long)&local_558._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff758);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  ScriptHash::ScriptHash
            ((ScriptHash *)CONCAT17(in_stack_fffffffffffff777,in_stack_fffffffffffff770),
             (CScript *)in_stack_fffffffffffff768);
  std::
  variant<CNoDestination,PubKeyDestination,PKHash,ScriptHash,WitnessV0ScriptHash,WitnessV0KeyHash,WitnessV1Taproot,PayToAnchor,WitnessUnknown>
  ::variant<ScriptHash,void,void,ScriptHash,void>
            ((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_fffffffffffff768,(ScriptHash *)in_stack_fffffffffffff760);
  GetScriptForDestination((CTxDestination *)in_stack_fffffffffffff758);
  CScript::operator=((CScript *)in_stack_fffffffffffff768,(CScript *)in_stack_fffffffffffff760);
  CScript::~CScript((CScript *)in_stack_fffffffffffff758);
  std::
  variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~variant((variant<CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
              *)in_stack_fffffffffffff758);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff768,
               (pointer)in_stack_fffffffffffff760,(unsigned_long)in_stack_fffffffffffff758);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff758);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff798._M_extent_value,
               in_stack_fffffffffffff790,(size_t)in_stack_fffffffffffff788,
               (const_string *)CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff760,(char (*) [1])in_stack_fffffffffffff758);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff768,
               (pointer)in_stack_fffffffffffff760,(unsigned_long)in_stack_fffffffffffff758);
    local_5b0._vptr_lazy_ostream._4_4_ =
         CScript::GetSigOpCount(in_stack_fffffffffffff778,(bool)in_stack_fffffffffffff777);
    local_5b0._vptr_lazy_ostream._0_4_ = 0;
    in_stack_fffffffffffff768 = "0U";
    in_stack_fffffffffffff760 = &local_5b0;
    in_stack_fffffffffffff758 = "p2sh.GetSigOpCount(true)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (local_598,&local_5b0.m_empty,0x3d,1,2,
               (undefined1 *)((long)&local_5b0._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff758);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff768,
               (pointer)in_stack_fffffffffffff760,(unsigned_long)in_stack_fffffffffffff758);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff758);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_fffffffffffff798._M_extent_value,
               in_stack_fffffffffffff790,(size_t)in_stack_fffffffffffff788,
               (const_string *)CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff760,(char (*) [1])in_stack_fffffffffffff758);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff768,
               (pointer)in_stack_fffffffffffff760,(unsigned_long)in_stack_fffffffffffff758);
    local_608._vptr_lazy_ostream._4_4_ =
         CScript::GetSigOpCount(in_stack_fffffffffffff778,(bool)in_stack_fffffffffffff777);
    local_608._vptr_lazy_ostream._0_4_ = 0;
    in_stack_fffffffffffff768 = "0U";
    in_stack_fffffffffffff760 = &local_608;
    in_stack_fffffffffffff758 = "p2sh.GetSigOpCount(false)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (local_5f0,&local_608.m_empty,0x3e,1,2,
               (undefined1 *)((long)&local_608._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff758);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  scriptSig_00 = local_1f8;
  CScript::CScript((CScript *)in_stack_fffffffffffff758);
  this_00 = CScript::operator<<((CScript *)in_stack_fffffffffffff790,
                                (opcodetype)((ulong)in_stack_fffffffffffff788 >> 0x20));
  ToByteVector<uint160>((uint160 *)in_stack_fffffffffffff798._M_extent_value);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_fffffffffffff768,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff760);
  b_02._M_extent._M_extent_value = in_stack_fffffffffffff798._M_extent_value;
  b_02._M_ptr = (pointer)in_stack_fffffffffffff790;
  CScript::operator<<(in_stack_fffffffffffff778,b_02);
  ToByteVector<uint160>((uint160 *)in_stack_fffffffffffff798._M_extent_value);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_fffffffffffff768,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff760);
  b_03._M_extent._M_extent_value = in_stack_fffffffffffff798._M_extent_value;
  b_03._M_ptr = (pointer)in_stack_fffffffffffff790;
  s._M_extent_value = (size_t)CScript::operator<<(in_stack_fffffffffffff778,b_03);
  Serialize((CScript *)s._M_extent_value);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ((span<const_unsigned_char,_18446744073709551615UL> *)in_stack_fffffffffffff768,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff760);
  b_04._M_extent._M_extent_value = s._M_extent_value;
  b_04._M_ptr = (pointer)in_stack_fffffffffffff790;
  CScript::operator<<(in_stack_fffffffffffff778,b_04);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff768);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff768);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffff768);
  do {
    file = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff768,
               (pointer)in_stack_fffffffffffff760,(unsigned_long)in_stack_fffffffffffff758);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffff758);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)s._M_extent_value,file,(size_t)in_stack_fffffffffffff788,
               (const_string *)CONCAT44(in_stack_fffffffffffff784,in_stack_fffffffffffff780));
    in_stack_fffffffffffff788 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_fffffffffffff760,(char (*) [1])in_stack_fffffffffffff758);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffff768,
               (pointer)in_stack_fffffffffffff760,(unsigned_long)in_stack_fffffffffffff758);
    in_stack_fffffffffffff784 = CScript::GetSigOpCount(this_00,scriptSig_00);
    local_6d8._vptr_lazy_ostream._0_4_ = 3;
    in_stack_fffffffffffff768 = "3U";
    in_stack_fffffffffffff760 = &local_6d8;
    in_stack_fffffffffffff758 = "p2sh.GetSigOpCount(scriptSig2)";
    local_6d8._vptr_lazy_ostream._4_4_ = in_stack_fffffffffffff784;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,unsigned_int>
              (local_6c0,&local_6d8.m_empty,0x41,1,2,
               (undefined1 *)((long)&local_6d8._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffff758);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
    in_stack_fffffffffffff780 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff780);
  } while (bVar1);
  CScript::~CScript((CScript *)in_stack_fffffffffffff758);
  CScript::~CScript((CScript *)in_stack_fffffffffffff758);
  std::vector<CPubKey,_std::allocator<CPubKey>_>::~vector
            ((vector<CPubKey,_std::allocator<CPubKey>_> *)in_stack_fffffffffffff768);
  CScript::~CScript((CScript *)in_stack_fffffffffffff758);
  CScript::~CScript((CScript *)in_stack_fffffffffffff758);
  CScript::~CScript((CScript *)in_stack_fffffffffffff758);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(GetSigOpCount)
{
    // Test CScript::GetSigOpCount()
    CScript s1;
    BOOST_CHECK_EQUAL(s1.GetSigOpCount(false), 0U);
    BOOST_CHECK_EQUAL(s1.GetSigOpCount(true), 0U);

    uint160 dummy;
    s1 << OP_1 << ToByteVector(dummy) << ToByteVector(dummy) << OP_2 << OP_CHECKMULTISIG;
    BOOST_CHECK_EQUAL(s1.GetSigOpCount(true), 2U);
    s1 << OP_IF << OP_CHECKSIG << OP_ENDIF;
    BOOST_CHECK_EQUAL(s1.GetSigOpCount(true), 3U);
    BOOST_CHECK_EQUAL(s1.GetSigOpCount(false), 21U);

    CScript p2sh = GetScriptForDestination(ScriptHash(s1));
    CScript scriptSig;
    scriptSig << OP_0 << Serialize(s1);
    BOOST_CHECK_EQUAL(p2sh.GetSigOpCount(scriptSig), 3U);

    std::vector<CPubKey> keys;
    for (int i = 0; i < 3; i++)
    {
        CKey k = GenerateRandomKey();
        keys.push_back(k.GetPubKey());
    }
    CScript s2 = GetScriptForMultisig(1, keys);
    BOOST_CHECK_EQUAL(s2.GetSigOpCount(true), 3U);
    BOOST_CHECK_EQUAL(s2.GetSigOpCount(false), 20U);

    p2sh = GetScriptForDestination(ScriptHash(s2));
    BOOST_CHECK_EQUAL(p2sh.GetSigOpCount(true), 0U);
    BOOST_CHECK_EQUAL(p2sh.GetSigOpCount(false), 0U);
    CScript scriptSig2;
    scriptSig2 << OP_1 << ToByteVector(dummy) << ToByteVector(dummy) << Serialize(s2);
    BOOST_CHECK_EQUAL(p2sh.GetSigOpCount(scriptSig2), 3U);
}